

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O1

void __thiscall
TApp_IncorrectConstructionDuplicateExcludesTxt_Test::TestBody
          (TApp_IncorrectConstructionDuplicateExcludesTxt_Test *this)

{
  bool bVar1;
  Option *this_00;
  App *this_01;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  AssertHelper local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"--cat","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  this_01 = &(this->super_TApp).app;
  this_00 = CLI::App::add_flag(this_01,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"--other","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"","");
  CLI::App::add_flag(this_01,&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"--other","");
      CLI::Option::excludes<CLI::App>(this_00,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"--other","");
      CLI::Option::excludes<CLI::App>(this_00,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xc9,
               "Expected: cat->excludes(\"--other\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    bVar1 = testing::internal::IsTrue(true);
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,200,
               "Expected: cat->excludes(\"--other\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    bVar1 = testing::internal::IsTrue(true);
  }
  if ((bVar1 != false) &&
     (local_f8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_f8.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionDuplicateExcludesTxt) {
    auto cat = app.add_flag("--cat");
    app.add_flag("--other");
    ASSERT_NO_THROW(cat->excludes("--other"));
    EXPECT_THROW(cat->excludes("--other"), CLI::OptionAlreadyAdded);
}